

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void sha1_update(sha1_ctx *ctx,uint8_t *input,uint32_t input_len)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong __n;
  
  uVar3 = ctx->count[0];
  ctx->count[0] = input_len * 8 + uVar3;
  if (CARRY4(input_len * 8,uVar3)) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  ctx->count[1] = ctx->count[1] + (input_len >> 0x1d);
  uVar3 = uVar3 >> 3 & 0x3f;
  uVar2 = (ulong)uVar3;
  if (input_len + uVar3 < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar3);
    memcpy(ctx->buf + uVar2,input,__n);
    sha1_transform(ctx->state,ctx->buf);
    uVar1 = uVar3 ^ 0x7f;
    if ((uVar3 ^ 0x7f) < input_len) {
      do {
        uVar3 = uVar1;
        sha1_transform(ctx->state,input + (uVar3 - 0x3f));
        uVar1 = uVar3 + 0x40;
      } while (uVar3 + 0x40 < input_len);
      uVar2 = 0;
      __n = (ulong)(uVar3 + 1);
    }
    else {
      uVar2 = 0;
    }
  }
  memcpy(ctx->buf + uVar2,input + __n,(ulong)(input_len - (int)__n));
  return;
}

Assistant:

void sha1_update(struct sha1_ctx *ctx, const uint8_t *input,
                 uint32_t input_len) {
  uint32_t i;
  uint32_t j;

  j = ctx->count[0];
  if ((ctx->count[0] += input_len << 3) < j)
    ctx->count[1]++;
  ctx->count[1] += (input_len >> 29);
  j = (j >> 3) & 63;
  if ((j + input_len) > 63) {
    memcpy(&ctx->buf[j], input, (i = 64 - j));
    sha1_transform(ctx->state, ctx->buf);
    for (; i + 63 < input_len; i += 64) {
      sha1_transform(ctx->state, &input[i]);
    }
    j = 0;
  } else {
    i = 0;
  }

  memcpy(&ctx->buf[j], &input[i], input_len - i);
}